

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

Camera * rw::Camera::streamRead(Stream *stream)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  Camera *cam;
  Error _e;
  CameraChunkData buf;
  Stream *stream_local;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    Stream::read32(stream,&_e,0x20);
    stream_local = (Stream *)create();
    (((Camera *)stream_local)->viewWindow).x = (float32)_e.plugin;
    (((Camera *)stream_local)->viewWindow).y = (float32)_e.code;
    ((Camera *)stream_local)->viewOffset = buf.viewWindow;
    ((Camera *)stream_local)->nearPlane = buf.viewOffset.x;
    ((Camera *)stream_local)->farPlane = buf.viewOffset.y;
    ((Camera *)stream_local)->fogPlane = buf.nearPlane;
    ((Camera *)stream_local)->projection = (int32)buf.farPlane;
    bVar1 = PluginList::streamRead((PluginList *)&s_plglist,stream,stream_local);
    if (!bVar1) {
      destroy((Camera *)stream_local);
      stream_local = (Stream *)0x0;
    }
  }
  else {
    cam._0_4_ = 5;
    cam._4_4_ = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/camera.cpp",0x1c8);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000004,"STRUCT");
    fprintf(__stream,"%s\n",pcVar2);
    setError((Error *)&cam);
    stream_local = (Stream *)0x0;
  }
  return (Camera *)stream_local;
}

Assistant:

Camera*
Camera::streamRead(Stream *stream)
{
	CameraChunkData buf;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(&buf, sizeof(CameraChunkData));
	Camera *cam = Camera::create();
	cam->viewWindow = buf.viewWindow;
	cam->viewOffset = buf.viewOffset;
	cam->nearPlane = buf.nearPlane;
	cam->farPlane = buf.farPlane;
	cam->fogPlane = buf.fogPlane;
	cam->projection = buf.projection;
	if(s_plglist.streamRead(stream, cam))
		return cam;
	cam->destroy();
	return nil;
}